

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O0

TestStatus *
vkt::api::anon_unknown_1::
createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::ComputePipeline>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  Environment *this;
  RefData<vk::Handle<(vk::HandleType)18>_> data;
  RefData<vk::Handle<(vk::HandleType)18>_> data_00;
  RefData<vk::Handle<(vk::HandleType)18>_> data_01;
  RefData<vk::Handle<(vk::HandleType)18>_> data_02;
  allocator<char> local_489;
  string local_488;
  Move<vk::Handle<(vk::HandleType)18>_> local_468;
  RefData<vk::Handle<(vk::HandleType)18>_> local_448;
  undefined1 local_428 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj3;
  RefData<vk::Handle<(vk::HandleType)18>_> local_3e8;
  undefined1 local_3c8 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj2;
  RefData<vk::Handle<(vk::HandleType)18>_> local_388;
  undefined1 local_368 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj1;
  RefData<vk::Handle<(vk::HandleType)18>_> local_328;
  undefined1 local_308 [8];
  Unique<vk::Handle<(vk::HandleType)18>_> obj0;
  Resources res3;
  Resources res2;
  undefined1 local_198 [8];
  Resources res1;
  Resources res0;
  Environment env;
  Context *context_local;
  TestStatus *local_10;
  
  this = (Environment *)
         &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.deleter.
          m_allocator;
  local_10 = __return_storage_ptr__;
  Environment::Environment(this,context,1);
  ComputePipeline::Resources::Resources
            ((Resources *)
             &res1.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,this,(Parameters *)((long)&context_local + 7));
  ComputePipeline::Resources::Resources
            ((Resources *)local_198,this,(Parameters *)((long)&context_local + 7));
  ComputePipeline::Resources::Resources
            ((Resources *)
             &res3.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ComputePipeline::Resources::Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ComputePipeline::create
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,
             (Resources *)
             &res1.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_328,
             (Move *)&obj1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
            );
  data.deleter.m_deviceIface = local_328.deleter.m_deviceIface;
  data.object.m_internal = local_328.object.m_internal;
  data.deleter.m_device = local_328.deleter.m_device;
  data.deleter.m_allocator = local_328.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_308,data);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj1.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  ComputePipeline::create
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,(Resources *)local_198,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_388,
             (Move *)&obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
            );
  data_00.deleter.m_deviceIface = local_388.deleter.m_deviceIface;
  data_00.object.m_internal = local_388.object.m_internal;
  data_00.deleter.m_device = local_388.deleter.m_device;
  data_00.deleter.m_allocator = local_388.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_368,data_00);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj2.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  ComputePipeline::create
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,
             (Resources *)
             &res3.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,(Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData
            (&local_3e8,
             (Move *)&obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator
            );
  data_01.deleter.m_deviceIface = local_3e8.deleter.m_deviceIface;
  data_01.object.m_internal = local_3e8.object.m_internal;
  data_01.deleter.m_device = local_3e8.deleter.m_device;
  data_01.deleter.m_allocator = local_3e8.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3c8,data_01);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move
            ((Move<vk::Handle<(vk::HandleType)18>_> *)
             &obj3.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  ComputePipeline::create
            (&local_468,
             (Environment *)
             &res0.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator,
             (Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator,
             (Parameters *)((long)&context_local + 7));
  ::vk::refdetails::Move::operator_cast_to_RefData(&local_448,(Move *)&local_468);
  data_02.deleter.m_deviceIface = local_448.deleter.m_deviceIface;
  data_02.object.m_internal = local_448.object.m_internal;
  data_02.deleter.m_device = local_448.deleter.m_device;
  data_02.deleter.m_allocator = local_448.deleter.m_allocator;
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_428,data_02);
  ::vk::refdetails::Move<vk::Handle<(vk::HandleType)18>_>::~Move(&local_468);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_428);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_3c8);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_368);
  ::vk::refdetails::Unique<vk::Handle<(vk::HandleType)18>_>::~Unique
            ((Unique<vk::Handle<(vk::HandleType)18>_> *)local_308);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"Ok",&local_489);
  tcu::TestStatus::pass(__return_storage_ptr__,&local_488);
  std::__cxx11::string::~string((string *)&local_488);
  std::allocator<char>::~allocator(&local_489);
  ComputePipeline::Resources::~Resources
            ((Resources *)
             &obj0.super_RefBase<vk::Handle<(vk::HandleType)18>_>.m_data.deleter.m_allocator);
  ComputePipeline::Resources::~Resources
            ((Resources *)
             &res3.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator);
  ComputePipeline::Resources::~Resources((Resources *)local_198);
  ComputePipeline::Resources::~Resources
            ((Resources *)
             &res1.pipelineCache.object.super_RefBase<vk::Handle<(vk::HandleType)15>_>.m_data.
              deleter.m_allocator);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}